

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsproxywidget.cpp
# Opt level: O0

void QGraphicsProxyWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QGraphicsProxyWidget *pQVar1;
  QWidget *in_RCX;
  int in_EDX;
  int in_ESI;
  QGraphicsProxyWidgetPrivate *in_RDI;
  QGraphicsProxyWidget *_r;
  QGraphicsProxyWidget *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      pQVar1 = newProxyWidget((QGraphicsProxyWidget *)0x0,in_RCX);
      if (*(long *)in_RCX != 0) {
        **(undefined8 **)in_RCX = pQVar1;
      }
    }
    else if (in_EDX == 1) {
      d_func((QGraphicsProxyWidget *)0x9beca6);
      QGraphicsProxyWidgetPrivate::_q_removeWidgetSlot(in_RDI);
    }
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsProxyWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { QGraphicsProxyWidget* _r = _t->newProxyWidget((*reinterpret_cast< std::add_pointer_t<const QWidget*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QGraphicsProxyWidget**>(_a[0]) = std::move(_r); }  break;
        case 1: _t->d_func()->_q_removeWidgetSlot(); break;
        default: ;
        }
    }
}